

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_connect(SessionHandle *data,connectdata **in_connect,_Bool *asyncp,
                     _Bool *protocol_done)

{
  hostname *conn;
  undefined1 auVar1 [16];
  uint uVar2;
  connectdata *pcVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 string;
  char cVar7;
  byte bVar8;
  unsigned_short uVar9;
  int iVar10;
  CURLcode CVar11;
  CURLcode CVar12;
  size_t sVar13;
  size_t sVar14;
  connectdata *pcVar15;
  char *pcVar16;
  curl_llist *pcVar17;
  size_t sVar18;
  char *pcVar19;
  size_t sVar20;
  char *pcVar21;
  size_t __n;
  size_t sVar22;
  char *pcVar23;
  byte *pbVar24;
  ulong uVar25;
  Curl_handler *pCVar26;
  long lVar27;
  ushort **ppuVar28;
  connectbundle *pcVar29;
  curl_llist_element *pcVar30;
  long lVar31;
  connectdata *pcVar32;
  connectdata *pcVar33;
  ulong uVar34;
  hostname *host;
  hostname *host_00;
  hostname *host_01;
  curl_proxytype cVar35;
  byte *__s;
  connectdata *conn_00;
  SessionHandle *pSVar36;
  Curl_handler **ppCVar37;
  curl_llist_element *pcVar38;
  bool bVar39;
  _Bool _Var40;
  bool bVar41;
  undefined1 auVar42 [16];
  timeval tVar43;
  timeval newer;
  long lStackY_300;
  char *local_2d0;
  byte *local_2c8;
  char *passwd;
  char *local_298;
  connectdata *local_290;
  uint local_284;
  Curl_handler *local_280;
  size_t local_278;
  _Bool *local_270;
  char *passwdp;
  size_t local_260;
  char *optionsp;
  size_t local_250;
  ssl_config_data *local_248;
  hostname *local_240;
  char protobuf [16];
  char *userp;
  undefined1 local_39;
  
  *asyncp = false;
  local_298 = (char *)0x0;
  passwd = (char *)0x0;
  sVar13 = Curl_multi_max_host_connections(data->multi);
  sVar14 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  local_270 = asyncp;
  if ((data->change).url == (char *)0x0) {
    CVar11 = CURLE_URL_MALFORMAT;
    goto LAB_0043b4b1;
  }
  local_278 = sVar13;
  local_260 = sVar14;
  pcVar15 = (connectdata *)(*Curl_ccalloc)(1,0x618);
  CVar11 = CURLE_OUT_OF_MEMORY;
  if (pcVar15 == (connectdata *)0x0) goto LAB_0043b4b1;
  pcVar15->handler = &Curl_handler_dummy;
  pcVar15->connection_id = -1;
  pcVar15->port = -1;
  pcVar15->remote_port = -1;
  pcVar15->sock[0] = -1;
  pcVar15->sock[1] = -1;
  pcVar15->tempsock[0] = -1;
  pcVar15->tempsock[1] = -1;
  (pcVar15->bits).close = true;
  local_290 = pcVar15;
  tVar43 = curlx_tvnow();
  pcVar15->created = tVar43;
  pcVar15->data = data;
  cVar35 = (data->set).proxytype;
  pcVar15->proxytype = cVar35;
  pcVar16 = (data->set).str[0x10];
  if (pcVar16 == (char *)0x0) {
    (pcVar15->bits).proxy = false;
LAB_0043b354:
    _Var40 = false;
  }
  else {
    bVar39 = *pcVar16 == '\0';
    (pcVar15->bits).proxy = !bVar39;
    if (bVar39) goto LAB_0043b354;
    if (cVar35 == CURLPROXY_HTTP) {
      _Var40 = true;
    }
    else {
      _Var40 = cVar35 == CURLPROXY_HTTP_1_0;
    }
  }
  (pcVar15->bits).httpproxy = _Var40;
  (pcVar15->bits).proxy_user_passwd = (data->set).str[0x1f] != (char *)0x0;
  (pcVar15->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (pcVar15->bits).user_passwd = (data->set).str[0x1c] != (char *)0x0;
  (pcVar15->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (pcVar15->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  pcVar15->verifypeer = (data->set).ssl.verifypeer;
  pcVar15->verifyhost = (data->set).ssl.verifyhost;
  pcVar15->ip_version = (data->set).ipver;
  _Var40 = Curl_multi_pipeline_enabled(data->multi);
  if ((_Var40) && (pcVar15->master_buffer == (char *)0x0)) {
    pcVar16 = (char *)(*Curl_ccalloc)(0x4000,1);
    pcVar15->master_buffer = pcVar16;
    if (pcVar16 != (char *)0x0) goto LAB_0043b400;
LAB_0043b43e:
    Curl_llist_destroy(pcVar15->send_pipe,(void *)0x0);
    Curl_llist_destroy(pcVar15->recv_pipe,(void *)0x0);
    pcVar15->send_pipe = (curl_llist *)0x0;
    pcVar15->recv_pipe = (curl_llist *)0x0;
    if (pcVar15->master_buffer != (char *)0x0) {
      (*Curl_cfree)(pcVar15->master_buffer);
      pcVar15->master_buffer = (char *)0x0;
    }
    if (pcVar15->localdev != (char *)0x0) {
      (*Curl_cfree)(pcVar15->localdev);
      pcVar15->localdev = (char *)0x0;
    }
    (*Curl_cfree)(pcVar15);
  }
  else {
LAB_0043b400:
    pcVar17 = Curl_llist_alloc(llist_dtor);
    pcVar15->send_pipe = pcVar17;
    pcVar17 = Curl_llist_alloc(llist_dtor);
    pcVar15->recv_pipe = pcVar17;
    if (pcVar17 == (curl_llist *)0x0 || pcVar15->send_pipe == (curl_llist *)0x0) goto LAB_0043b43e;
    pcVar16 = (data->set).str[5];
    if (pcVar16 != (char *)0x0) {
      pcVar16 = (*Curl_cstrdup)(pcVar16);
      pcVar15->localdev = pcVar16;
      if (pcVar16 == (char *)0x0) goto LAB_0043b43e;
    }
    pcVar15->localportrange = (data->set).localportrange;
    pcVar15->localport = (data->set).localport;
    pvVar4 = (data->set).closesocket_client;
    pcVar15->fclosesocket = (data->set).fclosesocket;
    pcVar15->closesocket_client = pvVar4;
    *in_connect = pcVar15;
    sVar18 = strlen((data->change).url);
    sVar20 = 0x100;
    if (0x100 < sVar18) {
      sVar20 = sVar18;
    }
    pcVar16 = (data->state).pathbuffer;
    if (pcVar16 != (char *)0x0) {
      (*Curl_cfree)(pcVar16);
      (data->state).pathbuffer = (char *)0x0;
    }
    (data->state).path = (char *)0x0;
    pcVar16 = (char *)(*Curl_cmalloc)(sVar20 + 2);
    (data->state).pathbuffer = pcVar16;
    if (pcVar16 != (char *)0x0) {
      (data->state).path = pcVar16;
      pcVar16 = (char *)(*Curl_cmalloc)(sVar20 + 2);
      (pcVar15->host).rawalloc = pcVar16;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = (data->state).pathbuffer;
        if (pcVar16 != (char *)0x0) {
          (*Curl_cfree)(pcVar16);
          (data->state).pathbuffer = (char *)0x0;
        }
        (data->state).path = (char *)0x0;
        goto LAB_0043b4b1;
      }
      (pcVar15->host).name = pcVar16;
      *pcVar16 = '\0';
      pcVar16 = (*Curl_cstrdup)("");
      local_298 = pcVar16;
      pcVar19 = (*Curl_cstrdup)("");
      passwd = pcVar19;
      local_2d0 = (*Curl_cstrdup)("");
      CVar12 = CURLE_OUT_OF_MEMORY;
      CVar11 = CVar12;
      if (local_2d0 != (char *)0x0 && (pcVar19 != (char *)0x0 && pcVar16 != (char *)0x0)) {
        pcVar16 = (data->state).path;
        protobuf[0] = '\0';
        protobuf[1] = '\0';
        protobuf[2] = '\0';
        protobuf[3] = '\0';
        protobuf[4] = '\0';
        protobuf[5] = '\0';
        protobuf[6] = '\0';
        protobuf[7] = '\0';
        protobuf[8] = '\0';
        protobuf[9] = '\0';
        protobuf[10] = '\0';
        protobuf[0xb] = '\0';
        protobuf[0xc] = '\0';
        protobuf[0xd] = '\0';
        protobuf[0xe] = '\0';
        protobuf[0xf] = '\0';
        iVar10 = __isoc99_sscanf((data->change).url,"%15[^:]:%[^\n]",protobuf,pcVar16);
        if (iVar10 == 2) {
          local_2c8 = (byte *)0x4aec80;
          iVar10 = Curl_raw_equal(protobuf,"file");
          if (iVar10 == 0) goto LAB_0043b7df;
          if (*pcVar16 == '/') {
            if (pcVar16[1] == '/') {
              sVar20 = strlen(pcVar16 + 2);
              memmove(pcVar16,pcVar16 + 2,sVar20 + 1);
              if (*pcVar16 != '/') goto LAB_0043b736;
            }
          }
          else {
LAB_0043b736:
            pcVar19 = strchr(pcVar16,0x2f);
            if (pcVar19 != (char *)0x0) {
              pcVar23 = pcVar19 + 1;
              if (pcVar19[1] != '/') {
                pcVar23 = pcVar19;
              }
              sVar20 = strlen(pcVar23);
              memmove(pcVar16,pcVar23,sVar20 + 1);
            }
          }
          bVar39 = false;
        }
        else {
LAB_0043b7df:
          *pcVar16 = '\0';
          iVar10 = __isoc99_sscanf((data->change).url,"%15[^\n:]://%[^\n/?]%[^\n]",protobuf,
                                   (pcVar15->host).name);
          local_2c8 = (byte *)protobuf;
          bVar39 = false;
          if (iVar10 < 2) {
            iVar10 = __isoc99_sscanf((data->change).url,"%[^\n/?]%[^\n]",(pcVar15->host).name,
                                     pcVar16);
            if (iVar10 < 1) {
              Curl_failf(data,"<url> malformed");
              CVar11 = CURLE_URL_MALFORMAT;
              goto LAB_0043c022;
            }
            iVar10 = Curl_raw_nequal("FTP.",(pcVar15->host).name,4);
            bVar39 = true;
            if (iVar10 == 0) {
              iVar10 = Curl_raw_nequal("DICT.",(pcVar15->host).name,5);
              if (iVar10 == 0) {
                iVar10 = Curl_raw_nequal("LDAP.",(pcVar15->host).name,5);
                if (iVar10 == 0) {
                  iVar10 = Curl_raw_nequal("IMAP.",(pcVar15->host).name,5);
                  if (iVar10 == 0) {
                    iVar10 = Curl_raw_nequal("SMTP.",(pcVar15->host).name,5);
                    if (iVar10 == 0) {
                      iVar10 = Curl_raw_nequal("POP3.",(pcVar15->host).name,5);
                      local_2c8 = (byte *)0x4b0cc9;
                      bVar39 = true;
                      if (iVar10 == 0) {
                        local_2c8 = (byte *)0x4b0cce;
                      }
                    }
                    else {
                      local_2c8 = (byte *)0x4b0cbe;
                    }
                  }
                  else {
                    local_2c8 = (byte *)0x4b0cb3;
                  }
                }
                else {
                  local_2c8 = (byte *)0x4b0ca8;
                }
              }
              else {
                local_2c8 = (byte *)0x4b0c9d;
              }
            }
            else {
              local_2c8 = (byte *)0x4b0c93;
            }
          }
        }
        pcVar19 = (pcVar15->host).name;
        pcVar21 = strchr(pcVar19,0x40);
        pcVar23 = pcVar21 + 1;
        if (pcVar21 == (char *)0x0) {
          pcVar23 = pcVar19;
        }
        pcVar19 = strchr(pcVar23,0x3f);
        bVar41 = pcVar19 != (char *)0x0;
        if (bVar41) {
          sVar20 = strlen(pcVar19);
          sVar18 = strlen(pcVar16);
          memmove(pcVar16 + sVar20 + 1,pcVar16,sVar18 + 1);
          memcpy(pcVar16 + 1,pcVar19,sVar20);
          *pcVar16 = '/';
          *pcVar19 = '\0';
          cVar7 = *pcVar16;
LAB_0043b99e:
          if (cVar7 != '?') goto LAB_0043b9d9;
          sVar20 = strlen(pcVar16);
          memmove(pcVar16 + 1,pcVar16,sVar20 + 1);
          *pcVar16 = '/';
          goto LAB_0043ba34;
        }
        cVar7 = *pcVar16;
        if (cVar7 != '\0') goto LAB_0043b99e;
        pcVar16[0] = '/';
        pcVar16[1] = '\0';
        bVar41 = true;
LAB_0043b9d9:
        pcVar19 = Curl_dedotdotify(pcVar16);
        if (pcVar19 == (char *)0x0) {
LAB_0043bbaa:
          CVar11 = CURLE_OUT_OF_MEMORY;
          goto LAB_0043c022;
        }
        iVar10 = strcmp(pcVar19,pcVar16);
        if (iVar10 == 0) {
          (*Curl_cfree)(pcVar19);
          if (bVar41) goto LAB_0043ba34;
        }
        else {
          (*Curl_cfree)((data->state).pathbuffer);
          (data->state).pathbuffer = pcVar19;
          (data->state).path = pcVar19;
          pcVar16 = pcVar19;
LAB_0043ba34:
          sVar20 = strlen(pcVar16);
          sVar18 = strlen((data->change).url);
          __n = strlen((pcVar15->host).name);
          if (!bVar39) {
            sVar22 = strlen((char *)local_2c8);
            __n = __n + sVar22 + 3;
          }
          pcVar19 = (char *)(*Curl_cmalloc)(sVar18 + 2);
          if (pcVar19 == (char *)0x0) goto LAB_0043bbaa;
          memcpy(pcVar19,(data->change).url,__n);
          memcpy(pcVar19 + __n,pcVar16,sVar20 + 1);
          if ((data->change).url_alloc == true) {
            pcVar23 = (data->change).url;
            if (pcVar23 != (char *)0x0) {
              (*Curl_cfree)(pcVar23);
              (data->change).url = (char *)0x0;
            }
            (data->change).url_alloc = false;
          }
          Curl_infof(data,"Rebuilt URL to: %s\n",pcVar19);
          (data->change).url = pcVar19;
          (data->change).url_alloc = true;
        }
        userp = (char *)0x0;
        passwdp = (char *)0x0;
        optionsp = (char *)0x0;
        pcVar19 = (pcVar15->host).name;
        pcVar23 = strchr(pcVar19,0x40);
        CVar11 = CURLE_OK;
        if (pcVar23 != (char *)0x0) {
          (pcVar15->host).name = pcVar23 + 1;
          if (((data->set).use_netrc != CURL_NETRC_REQUIRED) &&
             (CVar11 = parse_login_details(pcVar19,(size_t)(pcVar23 + 1 + ~(ulong)pcVar19),&userp,
                                           &passwdp,&optionsp), CVar11 == CURLE_OK)) {
            if (userp == (char *)0x0) {
LAB_0043bbf9:
              if (passwdp != (char *)0x0) {
                pcVar19 = curl_easy_unescape(data,passwdp,0,(int *)0x0);
                if (pcVar19 == (char *)0x0) goto LAB_0043bc6a;
                (*Curl_cfree)(passwd);
                passwd = pcVar19;
              }
              CVar11 = CURLE_OK;
              if (optionsp != (char *)0x0) {
                CVar11 = CURLE_OK;
                pcVar19 = curl_easy_unescape(data,optionsp,0,(int *)0x0);
                if (pcVar19 == (char *)0x0) goto LAB_0043bc6a;
                (*Curl_cfree)(local_2d0);
                local_2d0 = pcVar19;
              }
            }
            else {
              (pcVar15->bits).userpwd_in_url = true;
              (pcVar15->bits).user_passwd = true;
              pcVar19 = curl_easy_unescape(data,userp,0,(int *)0x0);
              if (pcVar19 != (char *)0x0) {
                (*Curl_cfree)(local_298);
                local_298 = pcVar19;
                goto LAB_0043bbf9;
              }
LAB_0043bc6a:
              CVar11 = CURLE_OUT_OF_MEMORY;
            }
          }
        }
        if (userp != (char *)0x0) {
          (*Curl_cfree)(userp);
          userp = (char *)0x0;
        }
        if (passwdp != (char *)0x0) {
          (*Curl_cfree)(passwdp);
          passwdp = (char *)0x0;
        }
        if (optionsp != (char *)0x0) {
          (*Curl_cfree)(optionsp);
        }
        if (CVar11 != CURLE_OK) goto LAB_0043c022;
        pcVar19 = (pcVar15->host).name;
        if ((*pcVar19 == '[') && (pbVar24 = (byte *)strchr(pcVar19,0x25), pbVar24 != (byte *)0x0)) {
          iVar10 = *pbVar24 - 0x25;
          if ((iVar10 == 0) && (iVar10 = pbVar24[1] - 0x32, iVar10 == 0)) {
            iVar10 = 0x35 - (uint)pbVar24[2];
          }
          else {
            iVar10 = -iVar10;
          }
          if (iVar10 == 0) {
            lStackY_300 = 3;
          }
          else {
            Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
            lStackY_300 = 1;
          }
          uVar25 = strtoul((char *)(pbVar24 + lStackY_300),&userp,10);
          pcVar19 = userp;
          if (*userp == ']') {
            sVar20 = strlen(userp);
            memmove(pbVar24,pcVar19,sVar20 + 1);
            pcVar15->scope = (uint)uVar25;
          }
          else {
            Curl_infof(data,"Invalid IPv6 address format\n");
          }
        }
        uVar2 = (data->set).scope;
        if (uVar2 != 0) {
          pcVar15->scope = uVar2;
        }
        pcVar16 = strchr(pcVar16,0x23);
        if (pcVar16 != (char *)0x0) {
          *pcVar16 = '\0';
          pcVar16 = strchr((data->change).url,0x23);
          if (pcVar16 != (char *)0x0) {
            *pcVar16 = '\0';
          }
        }
        pcVar32 = local_290;
        local_240 = &local_290->host;
        ppCVar37 = protocols;
        do {
          pCVar26 = *ppCVar37;
          if (pCVar26 == (Curl_handler *)0x0) goto LAB_0043bff6;
          iVar10 = Curl_raw_equal(pCVar26->scheme,(char *)local_2c8);
          ppCVar37 = ppCVar37 + 1;
        } while (iVar10 == 0);
        if ((((uint)(data->set).allowed_protocols & pCVar26->protocol) == 0) ||
           (((data->state).this_is_a_follow == true &&
            (((uint)(data->set).redir_protocols & pCVar26->protocol) == 0)))) {
LAB_0043bff6:
          Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_2c8);
          CVar11 = CURLE_UNSUPPORTED_PROTOCOL;
          goto LAB_0043c022;
        }
        pcVar15->given = pCVar26;
        pcVar15->handler = pCVar26;
        if (bVar39) {
          pcVar16 = curl_maprintf("%s://%s",pCVar26->scheme,(data->change).url);
          CVar11 = CVar12;
          if (pcVar16 == (char *)0x0) goto LAB_0043c022;
          if (((data->change).url_alloc == true) &&
             (pcVar19 = (data->change).url, pcVar19 != (char *)0x0)) {
            (*Curl_cfree)(pcVar19);
          }
          (data->change).url = pcVar16;
          (data->change).url_alloc = true;
          pCVar26 = pcVar15->given;
        }
        if (((pCVar26->flags & 0x40) != 0) &&
           (pcVar16 = strchr((pcVar15->data->state).path,0x3f), pcVar16 != (char *)0x0)) {
          *pcVar16 = '\0';
        }
        pcVar16 = (data->set).str[0x27];
        if (pcVar16 != (char *)0x0) {
          pcVar16 = (*Curl_cstrdup)(pcVar16);
          pcVar15->xoauth2_bearer = pcVar16;
          CVar11 = CVar12;
          if (pcVar16 == (char *)0x0) goto LAB_0043c022;
        }
        if ((pcVar15->bits).proxy_user_passwd == true) {
          memset(protobuf,0,0x100);
          memset(&userp,0,0x100);
          pcVar16 = (data->set).str[0x1f];
          if (pcVar16 != (char *)0x0) {
            strncpy(protobuf,pcVar16,0x100);
          }
          pcVar16 = (data->set).str[0x20];
          if (pcVar16 != (char *)0x0) {
            strncpy((char *)&userp,pcVar16,0x100);
            local_39 = 0;
          }
          pcVar16 = curl_easy_unescape(data,protobuf,0,(int *)0x0);
          pcVar15->proxyuser = pcVar16;
          CVar11 = CVar12;
          if (pcVar16 != (char *)0x0) {
            pcVar16 = curl_easy_unescape(data,(char *)&userp,0,(int *)0x0);
            pcVar15->proxypasswd = pcVar16;
            if (pcVar16 != (char *)0x0) goto LAB_0043bfc5;
          }
          goto LAB_0043c022;
        }
LAB_0043bfc5:
        pcVar16 = (data->set).str[0x10];
        if (pcVar16 == (char *)0x0) {
          pbVar24 = (byte *)0x0;
        }
        else {
          pbVar24 = (byte *)(*Curl_cstrdup)(pcVar16);
          if (pbVar24 == (byte *)0x0) {
            Curl_failf(data,"memory shortage");
            CVar11 = CVar12;
            goto LAB_0043c022;
          }
        }
        pcVar16 = (data->set).str[0x21];
        if ((pcVar16 == (char *)0x0) ||
           (_Var40 = check_noproxy((pcVar15->host).name,pcVar16), !_Var40)) {
          if (pbVar24 == (byte *)0x0) {
            pcVar16 = curl_getenv("no_proxy");
            if (pcVar16 == (char *)0x0) {
              pcVar16 = curl_getenv("NO_PROXY");
            }
            _Var40 = check_noproxy((pcVar15->host).name,pcVar16);
            if (_Var40) {
              pbVar24 = (byte *)0x0;
            }
            else {
              pcVar19 = pcVar15->handler->scheme;
              for (lVar27 = 0; cVar7 = pcVar19[lVar27], cVar7 != '\0'; lVar27 = lVar27 + 1) {
                iVar10 = tolower((int)cVar7);
                protobuf[lVar27] = (char)iVar10;
              }
              builtin_strncpy(protobuf + lVar27,"_proxy",7);
              pbVar24 = (byte *)curl_getenv(protobuf);
              if (pbVar24 == (byte *)0x0) {
                iVar10 = Curl_raw_equal("http_proxy",protobuf);
                if (iVar10 == 0) {
                  Curl_strntoupper(protobuf,protobuf,0x80);
                  pbVar24 = (byte *)curl_getenv(protobuf);
                  if (pbVar24 != (byte *)0x0) goto LAB_0043c0fe;
                }
              }
              else {
LAB_0043c0fe:
                if (*pbVar24 != 0) goto LAB_0043c17b;
              }
              pbVar24 = (byte *)curl_getenv("all_proxy");
              if (pbVar24 == (byte *)0x0) {
                pbVar24 = (byte *)curl_getenv("ALL_PROXY");
              }
            }
LAB_0043c17b:
            if (pcVar16 != (char *)0x0) {
              (*Curl_cfree)(pcVar16);
            }
            if (pbVar24 == (byte *)0x0) goto LAB_0043c202;
          }
          if ((*pbVar24 == 0) || ((pcVar15->handler->flags & 0x10) != 0)) goto LAB_0043c1f6;
          pcVar16 = strstr((char *)pbVar24,"://");
          local_2c8 = pbVar24;
          if (pcVar16 != (char *)0x0) {
            local_2c8 = (byte *)(pcVar16 + 3);
            iVar10 = Curl_raw_nequal("socks5h",(char *)pbVar24,7);
            if (iVar10 == 0) {
              iVar10 = Curl_raw_nequal("socks5",(char *)pbVar24,6);
              if (iVar10 == 0) {
                iVar10 = Curl_raw_nequal("socks4a",(char *)pbVar24,7);
                if (iVar10 == 0) {
                  iVar10 = Curl_raw_nequal("socks4",(char *)pbVar24,6);
                  cVar35 = CURLPROXY_SOCKS4;
                  if ((iVar10 == 0) &&
                     (iVar10 = Curl_raw_nequal("socks",(char *)pbVar24,5), iVar10 == 0))
                  goto LAB_0043c8bf;
                }
                else {
                  cVar35 = CURLPROXY_SOCKS4A;
                }
              }
              else {
                cVar35 = CURLPROXY_SOCKS5;
              }
            }
            else {
              cVar35 = CURLPROXY_SOCKS5_HOSTNAME;
            }
            pcVar15->proxytype = cVar35;
          }
LAB_0043c8bf:
          pcVar16 = strchr((char *)local_2c8,0x40);
          if (pcVar16 == (char *)0x0) {
LAB_0043c946:
            __s = local_2c8;
            if (*local_2c8 == 0x5b) {
              local_2c8 = local_2c8 + 1;
              __s = local_2c8;
              while( true ) {
                bVar8 = *__s;
                if ((ulong)bVar8 == 0) break;
                ppuVar28 = __ctype_b_loc();
                if (((((*ppuVar28)[bVar8] >> 0xc & 1) == 0) && (bVar8 != 0x2e)) && (bVar8 != 0x3a))
                {
                  if (bVar8 != 0x25) goto LAB_0043cb97;
                  if (__s[1] - 0x32 == 0) {
                    iVar10 = 0x35 - (uint)__s[2];
                  }
                  else {
                    iVar10 = -(__s[1] - 0x32);
                  }
                  if (iVar10 != 0) {
                    Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                  }
                  goto LAB_0043cb67;
                }
                __s = __s + 1;
              }
              goto LAB_0043cba5;
            }
            goto LAB_0043cbb8;
          }
          auVar1._8_8_ = 0;
          auVar1[0] = protobuf[8];
          auVar1[1] = protobuf[9];
          auVar1[2] = protobuf[10];
          auVar1[3] = protobuf[0xb];
          auVar1[4] = protobuf[0xc];
          auVar1[5] = protobuf[0xd];
          auVar1[6] = protobuf[0xe];
          auVar1[7] = protobuf[0xf];
          protobuf = (char  [16])(auVar1 << 0x40);
          userp = (char *)0x0;
          CVar11 = parse_login_details((char *)local_2c8,(long)pcVar16 - (long)local_2c8,
                                       (char **)protobuf,&userp,(char **)0x0);
          if (CVar11 == CURLE_OK) {
            if (pcVar15->proxyuser != (char *)0x0) {
              (*Curl_cfree)(pcVar15->proxyuser);
              pcVar15->proxyuser = (char *)0x0;
            }
            string = protobuf._0_8_;
            if ((protobuf._0_8_ == 0) || (sVar20 = strlen((char *)protobuf._0_8_), 0xff < sVar20)) {
              pcVar19 = (*Curl_cstrdup)("");
            }
            else {
              pcVar19 = curl_easy_unescape(data,(char *)string,0,(int *)0x0);
            }
            pcVar15->proxyuser = pcVar19;
            CVar11 = CURLE_OUT_OF_MEMORY;
            if (pcVar19 != (char *)0x0) {
              if (pcVar15->proxypasswd != (char *)0x0) {
                (*Curl_cfree)(pcVar15->proxypasswd);
                pcVar15->proxypasswd = (char *)0x0;
              }
              pcVar19 = userp;
              if ((userp == (char *)0x0) || (sVar20 = strlen(userp), 0xff < sVar20)) {
                pcVar19 = (*Curl_cstrdup)("");
              }
              else {
                pcVar19 = curl_easy_unescape(data,pcVar19,0,(int *)0x0);
              }
              pcVar15->proxypasswd = pcVar19;
              if (pcVar19 != (char *)0x0) {
                (pcVar15->bits).proxy_user_passwd = true;
                local_2c8 = (byte *)(pcVar16 + 1);
                CVar11 = CURLE_OK;
              }
            }
          }
          if (protobuf._0_8_ != 0) {
            (*Curl_cfree)((void *)protobuf._0_8_);
            auVar6._8_8_ = 0;
            auVar6[0] = protobuf[8];
            auVar6[1] = protobuf[9];
            auVar6[2] = protobuf[10];
            auVar6[3] = protobuf[0xb];
            auVar6[4] = protobuf[0xc];
            auVar6[5] = protobuf[0xd];
            auVar6[6] = protobuf[0xe];
            auVar6[7] = protobuf[0xf];
            protobuf = (char  [16])(auVar6 << 0x40);
          }
          if (userp != (char *)0x0) {
            (*Curl_cfree)(userp);
          }
          if (CVar11 == CURLE_OK) goto LAB_0043c946;
          goto LAB_0043cc0d;
        }
        if (pbVar24 != (byte *)0x0) {
LAB_0043c1f6:
          (*Curl_cfree)(pbVar24);
        }
LAB_0043c202:
        (pcVar15->bits).proxy = false;
        (pcVar15->bits).httpproxy = false;
        (pcVar15->bits).proxy_user_passwd = false;
        (pcVar15->bits).tunnel_proxy = false;
        bVar8 = 1;
        goto LAB_0043c21a;
      }
      goto LAB_0043c022;
    }
  }
LAB_0043b4ac:
  CVar11 = CURLE_OUT_OF_MEMORY;
LAB_0043b4b1:
  if (passwd != (char *)0x0) {
    (*Curl_cfree)(passwd);
    passwd = (char *)0x0;
  }
  if (local_298 != (char *)0x0) {
    (*Curl_cfree)(local_298);
  }
  if (CVar11 == CURLE_OK) {
    pcVar15 = *in_connect;
    if ((pcVar15->send_pipe->size != 0) || (pcVar15->recv_pipe->size != 0)) {
      *protocol_done = true;
      return CURLE_OK;
    }
    if (*local_270 != false) {
      return CURLE_OK;
    }
    CVar11 = Curl_setup_conn(pcVar15,protocol_done);
  }
  if (CVar11 != CURLE_OK) {
    if (CVar11 == CURLE_NO_CONNECTION_AVAILABLE) {
      *in_connect = (connectdata *)0x0;
      CVar11 = CURLE_NO_CONNECTION_AVAILABLE;
    }
    else if (*in_connect != (connectdata *)0x0) {
      Curl_disconnect(*in_connect,false);
      *in_connect = (connectdata *)0x0;
    }
  }
  return CVar11;
  while (((((*ppuVar28)[bVar8] & 0x1400) != 0 || (bVar8 - 0x2d < 2)) ||
         ((bVar8 == 0x7e || (bVar8 == 0x5f))))) {
LAB_0043cb67:
    __s = __s + 1;
    bVar8 = *__s;
    if ((ulong)bVar8 == 0) goto LAB_0043cba5;
  }
LAB_0043cb97:
  if (bVar8 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_0043cba5:
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_0043cbb8:
  pcVar16 = strchr((char *)__s,0x3a);
  if (pcVar16 == (char *)0x0) {
    if (*local_2c8 != 0x2f) {
      pcVar16 = strchr((char *)local_2c8,0x2f);
      if (pcVar16 != (char *)0x0) {
        *pcVar16 = '\0';
      }
      lVar27 = (data->set).proxyport;
      if (lVar27 != 0) goto LAB_0043cbdf;
      goto LAB_0043cbe6;
    }
    CVar11 = CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    *pcVar16 = '\0';
    lVar27 = strtol(pcVar16 + 1,(char **)0x0,10);
LAB_0043cbdf:
    pcVar15->port = lVar27;
LAB_0043cbe6:
    pcVar16 = (*Curl_cstrdup)((char *)local_2c8);
    (pcVar15->proxy).rawalloc = pcVar16;
    (pcVar15->proxy).name = pcVar16;
    CVar11 = CURLE_OUT_OF_MEMORY;
    if (pcVar16 != (char *)0x0) {
      CVar11 = CURLE_OK;
    }
  }
LAB_0043cc0d:
  (*Curl_cfree)(pbVar24);
  if (CVar11 == CURLE_OK) {
    if (pcVar15->proxytype < 2) {
      _Var40 = true;
      if (((pcVar15->handler->protocol & 3) == 0) && ((pcVar15->bits).tunnel_proxy == false)) {
        pcVar15->handler = &Curl_handler_http;
      }
    }
    else {
      _Var40 = false;
    }
    (pcVar15->bits).httpproxy = _Var40;
    (pcVar15->bits).proxy = true;
    bVar8 = _Var40 ^ 1;
LAB_0043c21a:
    if ((pcVar15->given->flags & 1) != 0 && bVar8 == 0) {
      (pcVar15->bits).tunnel_proxy = true;
    }
    iVar10 = __isoc99_sscanf((pcVar15->host).name,"[%*45[0123456789abcdefABCDEF:.]%c",&userp);
    if ((iVar10 == 1) && ((char)userp == ']')) {
      (pcVar15->bits).ipv6_ip = true;
      pcVar16 = (pcVar15->host).name + 1;
      (pcVar15->host).name = pcVar16;
      pcVar19 = strchr(pcVar16,0x5d);
      if (pcVar19 == (char *)0x0) {
        pcVar16 = (char *)0x0;
      }
      else {
        *pcVar19 = '\0';
        pcVar16 = (char *)0x0;
        if (pcVar19[1] == ':') {
          pcVar16 = pcVar19 + 1;
        }
      }
    }
    else {
      pcVar16 = strrchr((pcVar15->host).name,0x3a);
    }
    lVar27 = (data->set).use_port;
    if ((lVar27 == 0) || ((data->state).allow_port != true)) {
      if (pcVar16 != (char *)0x0) {
        uVar25 = strtol(pcVar16 + 1,(char **)protobuf,10);
        if (0xffff < uVar25) {
          Curl_failf(data,"Port number out of range");
          CVar11 = CURLE_URL_MALFORMAT;
          goto LAB_0043c022;
        }
        *pcVar16 = '\0';
        if ((char *)protobuf._0_8_ != pcVar16 + 1) {
          uVar9 = curlx_ultous(uVar25);
          pcVar15->remote_port = (uint)uVar9;
        }
      }
    }
    else {
      pcVar15->remote_port = (uint)lVar27 & 0xffff;
      if (pcVar16 != (char *)0x0) {
        *pcVar16 = '\0';
      }
      if ((pcVar15->bits).httpproxy == true) {
        protobuf[8] = '\0';
        protobuf[9] = '\0';
        protobuf[10] = '\0';
        protobuf[0xb] = '\0';
        auVar5._8_8_ = 0;
        auVar5[0] = protobuf[8];
        auVar5[1] = protobuf[9];
        auVar5[2] = protobuf[10];
        auVar5[3] = protobuf[0xb];
        auVar5[4] = protobuf[0xc];
        auVar5[5] = protobuf[0xd];
        auVar5[6] = protobuf[0xe];
        auVar5[7] = protobuf[0xf];
        protobuf = (char  [16])(auVar5 << 0x40);
        if ((pcVar15->bits).type_set == true) {
          if ((data->set).prefer_ascii == false) {
            uVar25 = (ulong)(((data->set).ftp_list_only ^ 1) * 5 + 0x44);
          }
          else {
            uVar25 = 0x41;
          }
          curl_msnprintf(protobuf,0xc,";type=%c",uVar25);
        }
        pcVar16 = "[";
        bVar39 = (pcVar15->bits).ipv6_ip == false;
        if (bVar39) {
          pcVar16 = "";
        }
        pcVar19 = "]";
        if (bVar39) {
          pcVar19 = "";
        }
        pcVar23 = "/";
        if ((data->state).slash_removed == false) {
          pcVar23 = "";
        }
        pcVar16 = curl_maprintf("%s://%s%s%s:%hu%s%s%s",pcVar15->given->scheme,pcVar16,
                                (pcVar15->host).name,pcVar19,(ulong)(uint)pcVar15->remote_port,
                                pcVar23,(data->state).path,protobuf);
        CVar11 = CVar12;
        if (pcVar16 == (char *)0x0) goto LAB_0043c022;
        if (((data->change).url_alloc == true) &&
           (pcVar19 = (data->change).url, pcVar19 != (char *)0x0)) {
          (*Curl_cfree)(pcVar19);
        }
        (data->change).url = pcVar16;
        (data->change).url_alloc = true;
      }
    }
    if ((data->set).str[0x1c] != (char *)0x0) {
      (*Curl_cfree)(local_298);
      local_298 = (*Curl_cstrdup)((data->set).str[0x1c]);
      CVar11 = CVar12;
      if (local_298 == (char *)0x0) goto LAB_0043c022;
    }
    if ((data->set).str[0x1d] != (char *)0x0) {
      (*Curl_cfree)(passwd);
      passwd = (*Curl_cstrdup)((data->set).str[0x1d]);
      CVar11 = CVar12;
      if (passwd == (char *)0x0) goto LAB_0043c022;
    }
    if ((data->set).str[0x1e] != (char *)0x0) {
      (*Curl_cfree)(local_2d0);
      local_2d0 = (*Curl_cstrdup)((data->set).str[0x1e]);
      if (local_2d0 == (char *)0x0) goto LAB_0043b4ac;
    }
    (pcVar15->bits).netrc = false;
    if ((data->set).use_netrc != CURL_NETRC_IGNORED) {
      iVar10 = Curl_parsenetrc((pcVar15->host).name,&local_298,&passwd,(data->set).str[0xe]);
      if (iVar10 < 1) {
        CVar11 = CVar12;
        if (iVar10 < 0) goto LAB_0043c022;
        (pcVar15->bits).netrc = true;
        (pcVar15->bits).user_passwd = true;
      }
      else {
        Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                   (pcVar15->host).name);
      }
    }
    pcVar16 = passwd;
    if (((pcVar15->handler->flags & 0x20) == 0) || ((pcVar15->bits).user_passwd != false)) {
      pcVar19 = (*Curl_cstrdup)(local_298);
      pcVar15->user = pcVar19;
      if (pcVar19 == (char *)0x0) goto LAB_0043c620;
LAB_0043c615:
      pcVar16 = (*Curl_cstrdup)(pcVar16);
    }
    else {
      pcVar16 = (*Curl_cstrdup)("anonymous");
      pcVar15->user = pcVar16;
      if (pcVar16 != (char *)0x0) {
        pcVar16 = "ftp@example.com";
        goto LAB_0043c615;
      }
LAB_0043c620:
      pcVar16 = (char *)0x0;
    }
    pcVar15->passwd = pcVar16;
    CVar11 = CVar12;
    if ((pcVar15->user == (char *)0x0) || (pcVar16 == (char *)0x0)) goto LAB_0043c022;
    if (*local_2d0 == '\0') {
LAB_0043c668:
      pSVar36 = pcVar15->data;
      Curl_free_request_state(pSVar36);
      memset(&pSVar36->req,0,0x138);
      (pSVar36->req).maxdownload = -1;
      pcVar15->socktype = 1;
      pCVar26 = pcVar15->handler;
      if (pCVar26->setup_connection == (_func_CURLcode_connectdata_ptr *)0x0) {
LAB_0043c6be:
        if (pcVar15->port < 0) {
          pcVar15->port = pCVar26->defport;
        }
        if (pcVar15->remote_port < 0) {
          pcVar15->remote_port = (uint)(ushort)pcVar15->given->defport;
        }
        pcVar15->recv[0] = Curl_recv_plain;
        pcVar15->send[0] = Curl_send_plain;
        pcVar15->recv[1] = Curl_recv_plain;
        pcVar15->send[1] = Curl_send_plain;
        if ((pCVar26->flags & 0x10) == 0) {
          pcVar16 = (data->set).str[0x15];
          (data->set).ssl.CApath = (data->set).str[0x14];
          (data->set).ssl.CAfile = pcVar16;
          pcVar16 = (data->set).str[0x1b];
          (data->set).ssl.CRLfile = (data->set).str[0x1a];
          (data->set).ssl.issuercert = pcVar16;
          auVar1 = *(undefined1 (*) [16])((data->set).str + 0x17);
          auVar42._0_8_ = auVar1._8_8_;
          auVar42._8_4_ = auVar1._0_4_;
          auVar42._12_4_ = auVar1._4_4_;
          (data->set).ssl.random_file = (char *)auVar42._0_8_;
          (data->set).ssl.egdsocket = (char *)auVar42._8_8_;
          (data->set).ssl.cipher_list = (data->set).str[0x16];
          local_248 = &local_290->ssl_config;
          _Var40 = Curl_clone_ssl_config(&(data->set).ssl,local_248);
          if (!_Var40) goto LAB_0043c83d;
          tVar43 = curlx_tvnow();
          lVar27 = curlx_tvdiff(tVar43,((data->state).conn_cache)->last_cleanup);
          if (999 < lVar27) {
            Curl_conncache_foreach((data->state).conn_cache,data,call_disconnect_if_dead);
            ((data->state).conn_cache)->last_cleanup = tVar43;
          }
          if (((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)) {
LAB_0043d2eb:
            pcVar29 = Curl_conncache_find_bundle((data->state).conn_cache,(pcVar15->host).name);
            bVar39 = false;
            if ((local_278 != 0) && (pcVar29 != (connectbundle *)0x0)) {
              if (pcVar29->num_connections < local_278) {
                bVar39 = false;
              }
              else {
                lVar27 = -1;
                tVar43 = curlx_tvnow();
                local_278 = tVar43.tv_usec;
                pcVar32 = (connectdata *)0x0;
                pcVar17 = pcVar29->conn_list;
                while (pcVar38 = pcVar17->head, pcVar38 != (curl_llist_element *)0x0) {
                  pcVar3 = (connectdata *)pcVar38->ptr;
                  if ((pcVar3->inuse == false) &&
                     (newer.tv_usec = local_278, newer.tv_sec = tVar43.tv_sec,
                     lVar31 = curlx_tvdiff(newer,pcVar3->now), lVar27 < lVar31)) {
                    pcVar32 = pcVar3;
                    lVar27 = lVar31;
                  }
                  pcVar17 = (curl_llist *)&pcVar38->next;
                }
                if (pcVar32 == (connectdata *)0x0) {
                  bVar39 = true;
                }
                else {
                  pcVar32->data = data;
                  bVar39 = false;
                  Curl_disconnect(pcVar32,false);
                }
              }
            }
            if ((local_260 == 0) || (((data->state).conn_cache)->num_connections < local_260)) {
LAB_0043d6a3:
              if (!bVar39) {
                ConnectionStore(data,pcVar15);
                if ((((data->state).authhost.picked & 0x28) != 0) &&
                   ((data->state).authhost.done == true)) {
                  Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
                  (data->state).authhost.picked = 0;
                }
                if ((((data->state).authproxy.picked & 0x28) != 0) &&
                   ((data->state).authproxy.done == true)) {
                  Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
                  (data->state).authproxy.picked = 0;
                }
                goto LAB_0043d75a;
              }
            }
            else {
              pcVar32 = find_oldest_idle_connection(data);
              if (pcVar32 != (connectdata *)0x0) {
                pcVar32->data = data;
                Curl_disconnect(pcVar32,false);
                goto LAB_0043d6a3;
              }
            }
            Curl_infof(data,"No connections available.\n");
            conn_free(pcVar15);
            *in_connect = (connectdata *)0x0;
            CVar11 = CURLE_NO_CONNECTION_AVAILABLE;
          }
          else {
            _Var40 = IsPipeliningPossible(data,pcVar15);
            if (((data->state).authhost.want & 0x28) == 0) {
              local_284 = 0;
            }
            else {
              local_284 = (uint)CONCAT71((int7)((ulong)pcVar15->handler >> 8),
                                         (pcVar15->handler->protocol & 3) != 0);
            }
            if (_Var40) {
              _Var40 = Curl_pipeline_site_blacklisted(data,pcVar15);
              bVar39 = !_Var40;
            }
            else {
              bVar39 = false;
            }
            pcVar29 = Curl_conncache_find_bundle((data->state).conn_cache,(pcVar15->host).name);
            if (pcVar29 == (connectbundle *)0x0) goto LAB_0043d2eb;
            local_250 = Curl_multi_max_pipeline_length(data->multi);
            bVar41 = false;
            Curl_infof(data,"Found bundle for host %s: %p\n",(pcVar15->host).name,pcVar29);
            if ((bVar39) && (bVar41 = true, pcVar29->server_supports_pipelining == false)) {
              bVar41 = false;
              Curl_infof(data,"Server doesn\'t support pipelining\n");
            }
            local_290 = (connectdata *)&local_290->user;
            pcVar38 = pcVar29->conn_list->head;
            sVar13 = local_250;
            pcVar3 = (connectdata *)0x0;
LAB_0043cd78:
            do {
              do {
                do {
                  do {
                    pcVar33 = pcVar3;
                    uVar25 = sVar13;
                    if (pcVar38 == (curl_llist_element *)0x0) {
                      conn_00 = pcVar33;
                      if (pcVar33 == (connectdata *)0x0) goto LAB_0043d2eb;
LAB_0043d256:
                      _Var40 = IsPipeliningPossible(data,conn_00);
                      if (((_Var40) && (conn_00->recv_pipe->size + conn_00->send_pipe->size != 0))
                         && ((Curl_infof(data,
                                         "Found connection %ld, with requests in the pipe (%zu)\n",
                                         conn_00->connection_id),
                             conn_00->bundle->num_connections < local_278 &&
                             (((data->state).conn_cache)->num_connections < local_260)))) {
                        Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
                        goto LAB_0043d2eb;
                      }
                      goto LAB_0043d35e;
                    }
                    conn_00 = (connectdata *)pcVar38->ptr;
                    pcVar38 = pcVar38->next;
                    _Var40 = disconnect_if_dead(conn_00,data);
                    sVar13 = uVar25;
                    pcVar3 = pcVar33;
                  } while (_Var40);
                  pcVar17 = conn_00->recv_pipe;
                  uVar34 = pcVar17->size + conn_00->send_pipe->size;
                  if (!bVar41) {
                    if (uVar34 == 0) {
                      if ((conn_00->sock[0] != -1) && ((conn_00->bits).close != true)) break;
                      Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse\n",
                                 conn_00->connection_id);
LAB_0043ce1f:
                      sVar13 = uVar25;
                      pcVar3 = pcVar33;
                    }
                    goto LAB_0043cd78;
                  }
                  pcVar30 = conn_00->send_pipe->head;
                  if (pcVar30 == (curl_llist_element *)0x0) {
                    pcVar30 = pcVar17->head;
                    if (pcVar30 == (curl_llist_element *)0x0) break;
LAB_0043ce32:
                    pSVar36 = (SessionHandle *)pcVar30->ptr;
LAB_0043ce35:
                    if (pSVar36 == (SessionHandle *)0x0) break;
                  }
                  else {
                    pSVar36 = (SessionHandle *)pcVar30->ptr;
                    pcVar30 = pcVar17->head;
                    if (pcVar30 == (curl_llist_element *)0x0) goto LAB_0043ce35;
                    if (pSVar36 == (SessionHandle *)0x0) goto LAB_0043ce32;
                  }
                  _Var40 = IsPipeliningPossible(pSVar36,conn_00);
                } while (!_Var40);
                local_280 = pcVar15->handler;
                uVar2 = local_280->flags;
              } while (((((((conn_00->handler->flags ^ uVar2) & 1) != 0) &&
                         ((local_280->protocol & conn_00->handler->protocol) == 0)) ||
                        (((uVar2 & 1) != 0 &&
                         (((data->set).ssl.verifypeer != conn_00->verifypeer ||
                          ((data->set).ssl.verifyhost != conn_00->verifyhost)))))) ||
                       ((pcVar15->bits).proxy != (conn_00->bits).proxy)) ||
                      ((!bVar41 && (conn_00->inuse != false))));
              pcVar16 = pcVar15->localdev;
            } while ((pcVar16 != (char *)0x0 || pcVar15->localport != 0) &&
                    ((((conn_00->localport != pcVar15->localport ||
                       (conn_00->localportrange != pcVar15->localportrange)) ||
                      (pcVar16 == (char *)0x0)) ||
                     ((conn_00->localdev == (char *)0x0 ||
                      (iVar10 = strcmp(conn_00->localdev,pcVar16), iVar10 != 0))))));
            if (-1 < (char)uVar2 || (local_284 & 1) != 0) {
              iVar10 = curl_strequal((char *)local_290->data,conn_00->user);
              if ((iVar10 == 0) ||
                 (iVar10 = curl_strequal(pcVar15->passwd,conn_00->passwd), iVar10 == 0))
              goto LAB_0043cd78;
              local_280 = pcVar15->handler;
            }
            if (((pcVar15->bits).httpproxy == true) && ((local_280->flags & 1) == 0)) {
              if ((((conn_00->bits).httpproxy == true) &&
                  ((((pcVar15->bits).tunnel_proxy == true && ((conn_00->bits).tunnel_proxy == true))
                   && (iVar10 = Curl_raw_equal((pcVar15->proxy).name,(conn_00->proxy).name),
                      iVar10 != 0)))) && (pcVar15->port == conn_00->port)) {
                local_280 = pcVar15->handler;
                goto LAB_0043cfc4;
              }
              if ((((conn_00->bits).proxy != true) ||
                  (((pcVar15->proxytype != conn_00->proxytype ||
                    ((pcVar15->bits).tunnel_proxy != (conn_00->bits).tunnel_proxy)) ||
                   (iVar10 = Curl_raw_equal((pcVar15->proxy).name,(conn_00->proxy).name),
                   iVar10 == 0)))) || (pcVar15->port != conn_00->port)) goto LAB_0043cd78;
            }
            else {
LAB_0043cfc4:
              iVar10 = Curl_raw_equal(local_280->scheme,conn_00->handler->scheme);
              if ((((iVar10 == 0) &&
                   ((pcVar15->handler->protocol & conn_00->handler->protocol) == 0)) ||
                  ((iVar10 = Curl_raw_equal((pcVar15->host).name,(conn_00->host).name), iVar10 == 0
                   || (pcVar15->remote_port != conn_00->remote_port)))) ||
                 (((pcVar15->handler->flags & 1) != 0 &&
                  ((_Var40 = Curl_ssl_config_matches(local_248,&conn_00->ssl_config), !_Var40 ||
                   (conn_00->ssl[0].state != ssl_connection_complete)))))) goto LAB_0043cd78;
            }
            if ((char)local_284 == '\0') {
              if (!(bool)(uVar34 != 0 & bVar41)) goto LAB_0043d256;
              if (((uVar34 < local_250) && (_Var40 = Curl_pipeline_penalized(data,conn_00), !_Var40)
                  ) && (sVar13 = uVar34, pcVar3 = conn_00, uVar25 <= uVar34)) goto LAB_0043ce1f;
              goto LAB_0043cd78;
            }
            pcVar3 = conn_00;
            if ((conn_00->ntlm).state == NTLMSTATE_NONE) goto LAB_0043cd78;
LAB_0043d35e:
            conn_00->inuse = true;
            pcVar16 = (pcVar15->proxy).rawalloc;
            if (pcVar16 != (char *)0x0) {
              (*Curl_cfree)(pcVar16);
            }
            Curl_free_ssl_config(local_248);
            conn_00->data = pcVar15->data;
            _Var40 = (pcVar15->bits).user_passwd;
            (conn_00->bits).user_passwd = _Var40;
            if (_Var40 == true) {
              if (conn_00->user != (char *)0x0) {
                (*Curl_cfree)(conn_00->user);
                conn_00->user = (char *)0x0;
              }
              if (conn_00->passwd != (char *)0x0) {
                (*Curl_cfree)(conn_00->passwd);
                conn_00->passwd = (char *)0x0;
              }
              pcVar16 = *(char **)(local_290->chunk).hexbuffer;
              conn_00->user = (char *)local_290->data;
              conn_00->passwd = pcVar16;
              local_290->data = (SessionHandle *)0x0;
              (local_290->chunk).hexbuffer[0] = '\0';
              (local_290->chunk).hexbuffer[1] = '\0';
              (local_290->chunk).hexbuffer[2] = '\0';
              (local_290->chunk).hexbuffer[3] = '\0';
              (local_290->chunk).hexbuffer[4] = '\0';
              (local_290->chunk).hexbuffer[5] = '\0';
              (local_290->chunk).hexbuffer[6] = '\0';
              (local_290->chunk).hexbuffer[7] = '\0';
            }
            _Var40 = (pcVar15->bits).proxy_user_passwd;
            (conn_00->bits).proxy_user_passwd = _Var40;
            if (_Var40 == true) {
              if (conn_00->proxyuser != (char *)0x0) {
                (*Curl_cfree)(conn_00->proxyuser);
                conn_00->proxyuser = (char *)0x0;
              }
              if (conn_00->proxypasswd != (char *)0x0) {
                (*Curl_cfree)(conn_00->proxypasswd);
                conn_00->proxypasswd = (char *)0x0;
              }
              pcVar16 = pcVar15->proxypasswd;
              conn_00->proxyuser = pcVar15->proxyuser;
              conn_00->proxypasswd = pcVar16;
              pcVar15->proxyuser = (char *)0x0;
              pcVar15->proxypasswd = (char *)0x0;
            }
            conn = &conn_00->host;
            pcVar16 = (conn_00->host).rawalloc;
            if (pcVar16 != (char *)0x0) {
              (*Curl_cfree)(pcVar16);
              conn->rawalloc = (char *)0x0;
            }
            pcVar16 = local_240->rawalloc;
            pcVar19 = local_240->encalloc;
            pcVar23 = local_240->dispname;
            (conn_00->host).name = local_240->name;
            (conn_00->host).dispname = pcVar23;
            conn->rawalloc = pcVar16;
            (conn_00->host).encalloc = pcVar19;
            Curl_persistconninfo(conn_00);
            (conn_00->bits).reuse = true;
            if (local_290->data != (SessionHandle *)0x0) {
              (*Curl_cfree)(local_290->data);
              local_290->data = (SessionHandle *)0x0;
            }
            if (pcVar15->passwd != (char *)0x0) {
              (*Curl_cfree)(pcVar15->passwd);
              pcVar15->passwd = (char *)0x0;
            }
            if (pcVar15->proxyuser != (char *)0x0) {
              (*Curl_cfree)(pcVar15->proxyuser);
              pcVar15->proxyuser = (char *)0x0;
            }
            if (pcVar15->proxypasswd != (char *)0x0) {
              (*Curl_cfree)(pcVar15->proxypasswd);
              pcVar15->proxypasswd = (char *)0x0;
            }
            if (pcVar15->localdev != (char *)0x0) {
              (*Curl_cfree)(pcVar15->localdev);
              pcVar15->localdev = (char *)0x0;
            }
            Curl_llist_destroy(pcVar15->send_pipe,(void *)0x0);
            Curl_llist_destroy(pcVar15->recv_pipe,(void *)0x0);
            pcVar32->send_pipe = (curl_llist *)0x0;
            pcVar32->recv_pipe = (curl_llist *)0x0;
            if (pcVar15->master_buffer != (char *)0x0) {
              (*Curl_cfree)(pcVar15->master_buffer);
              pcVar15->master_buffer = (char *)0x0;
            }
            (*Curl_cfree)(pcVar15);
            *in_connect = conn_00;
            fix_hostname(data,(connectdata *)conn,host);
            Curl_infof(data,"Re-using existing connection! (#%ld) with host %s\n",
                       conn_00->connection_id,
                       *(undefined8 *)
                        (conn_00->primary_ip +
                        (ulong)((conn_00->proxy).name != (char *)0x0) * 0x20 + -0x34));
            pcVar15 = conn_00;
LAB_0043d75a:
            pcVar15->inuse = true;
            do_init(pcVar15);
            CVar11 = setup_range(data);
            if (CVar11 == CURLE_OK) {
              pcVar15->fread_func = (data->set).fread_func;
              pcVar15->fread_in = (data->set).in;
              pcVar15->seek_func = (data->set).seek_func;
              pcVar15->seek_client = (data->set).seek_client;
              lVar27 = Curl_timeleft(data,(timeval *)0x0,true);
              if ((pcVar15->bits).reuse == true) {
                *local_270 = false;
                CVar11 = CURLE_OK;
              }
              else {
                fix_hostname(data,(connectdata *)&pcVar15->host,host_00);
                pcVar16 = (pcVar15->proxy).name;
                if ((pcVar16 == (char *)0x0) || (*pcVar16 == '\0')) {
                  pcVar15->port = (long)pcVar15->remote_port;
                  iVar10 = Curl_resolv_timeout(pcVar15,(pcVar15->host).name,pcVar15->remote_port,
                                               (Curl_dns_entry **)protobuf,lVar27);
                  if (iVar10 == -2) goto LAB_0043d8af;
                  if (iVar10 == 1) goto LAB_0043d8a2;
                  if (protobuf._0_8_ == 0) {
                    CVar11 = CURLE_COULDNT_RESOLVE_HOST;
                    pcVar16 = (pcVar15->host).dispname;
                    pcVar19 = "Couldn\'t resolve host \'%s\'";
                    goto LAB_0043d8e8;
                  }
LAB_0043d8c0:
                  CVar11 = CURLE_OK;
                }
                else {
                  fix_hostname(data,(connectdata *)&pcVar15->proxy,host_01);
                  iVar10 = Curl_resolv_timeout(pcVar15,(pcVar15->proxy).name,(int)pcVar15->port,
                                               (Curl_dns_entry **)protobuf,lVar27);
                  if (iVar10 == -2) {
LAB_0043d8af:
                    CVar11 = CURLE_OPERATION_TIMEDOUT;
                  }
                  else {
                    if (iVar10 == 1) {
LAB_0043d8a2:
                      *local_270 = true;
                      goto LAB_0043d8c0;
                    }
                    if (protobuf._0_8_ != 0) goto LAB_0043d8c0;
                    CVar11 = CURLE_COULDNT_RESOLVE_PROXY;
                    pcVar16 = (pcVar15->proxy).dispname;
                    pcVar19 = "Couldn\'t resolve proxy \'%s\'";
LAB_0043d8e8:
                    Curl_failf(data,pcVar19,pcVar16);
                  }
                }
                pcVar15->dns_entry = (Curl_dns_entry *)protobuf._0_8_;
              }
            }
          }
          goto LAB_0043c022;
        }
        CVar12 = (*pCVar26->connect_it)(pcVar15,(_Bool *)protobuf);
        if (CVar12 == CURLE_OK) {
          pcVar15->data = data;
          (pcVar15->bits).tcpconnect[0] = true;
          ConnectionStore(data,pcVar15);
          CVar11 = setup_range(data);
          if (CVar11 != CURLE_OK) {
            (*pcVar15->handler->done)(pcVar15,CVar11,false);
            goto LAB_0043c02b;
          }
          Curl_setup_transfer(pcVar15,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
        }
        do_init(pcVar15);
        CVar11 = CVar12;
      }
      else {
        CVar11 = (*pCVar26->setup_connection)(pcVar15);
        if (CVar11 == CURLE_OK) {
          pCVar26 = pcVar15->handler;
          goto LAB_0043c6be;
        }
      }
    }
    else {
      pcVar16 = (*Curl_cstrdup)(local_2d0);
      pcVar15->options = pcVar16;
      if (pcVar16 != (char *)0x0) goto LAB_0043c668;
LAB_0043c83d:
      CVar11 = CURLE_OUT_OF_MEMORY;
    }
  }
  else {
LAB_0043c022:
    if (local_2d0 == (char *)0x0) goto LAB_0043b4b1;
  }
LAB_0043c02b:
  (*Curl_cfree)(local_2d0);
  goto LAB_0043b4b1;
}

Assistant:

CURLcode Curl_connect(struct SessionHandle *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode code;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  code = create_conn(data, in_connect, asyncp);

  if(CURLE_OK == code) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      code = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(code == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return code;
  }

  if(code && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return code;
}